

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

char * testing::TestPartResultTypeToString(Type type)

{
  char *pcStack_10;
  Type type_local;
  
  if (type == kSuccess) {
    pcStack_10 = "Success";
  }
  else if (type - kNonFatalFailure < 2) {
    pcStack_10 = "Failure\n";
  }
  else {
    pcStack_10 = "Unknown result type";
  }
  return pcStack_10;
}

Assistant:

static const char * TestPartResultTypeToString(TestPartResult::Type type) {
  switch (type) {
    case TestPartResult::kSuccess:
      return "Success";

    case TestPartResult::kNonFatalFailure:
    case TestPartResult::kFatalFailure:
#ifdef _MSC_VER
      return "error: ";
#else
      return "Failure\n";
#endif
    default:
      return "Unknown result type";
  }
}